

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_sar8v_mips64el(void *d,void *a,void *b,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    *(char *)((long)d + uVar2) = *(char *)((long)a + uVar2) >> (*(byte *)((long)b + uVar2) & 7);
    uVar2 = uVar2 + 1;
  } while (uVar1 + 8 != uVar2);
  if ((desc >> 2 & 0xf8) <= uVar1) {
    return;
  }
  helper_gvec_sar8v_mips64el_cold_1();
  return;
}

Assistant:

void HELPER(gvec_sar8v)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int8_t)) {
        uint8_t sh = *(uint8_t *)((char *)b + i) & 7;
        *(int8_t *)((char *)d + i) = *(int8_t *)((char *)a + i) >> sh;
    }
    clear_high(d, oprsz, desc);
}